

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CircularBuffer.h
# Opt level: O0

size_t __thiscall
axl::sl::CircularBufferBase<wchar_t>::writeBack
          (CircularBufferBase<wchar_t> *this,wchar_t *p,size_t length)

{
  size_t sVar1;
  ulong uVar2;
  ulong in_RDX;
  wchar_t *in_RSI;
  ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *in_RDI;
  CircularBufferBase<wchar_t> *unaff_retaddr;
  size_t leftover;
  ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *i;
  
  i = in_RDI;
  sVar1 = ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::getCount(in_RDI);
  uVar2 = sVar1 - in_RDI[1].m_count;
  if (uVar2 < in_RDX) {
    in_RDX = uVar2;
  }
  copyTo(unaff_retaddr,(size_t)i,in_RSI,in_RDX);
  uVar2 = (long)&((in_RDI[1].m_hdr)->super_RefCount)._vptr_RefCount + in_RDX;
  sVar1 = ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::getCount(in_RDI);
  in_RDI[1].m_hdr = (Hdr *)(uVar2 % sVar1);
  in_RDI[1].m_count = in_RDX + in_RDI[1].m_count;
  return in_RDX;
}

Assistant:

size_t
	writeBack(
		const C* p,
		size_t length
	) {
		size_t leftover = m_buffer.getCount() - m_length;
		if (length > leftover)
			length = leftover;

		copyTo(m_back, p, length);
		m_back = (m_back + length) % m_buffer.getCount();
		m_length += length;

		ASSERT(isValid());
		return length;
	}